

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int __thiscall Pathie::Path::remove(Path *this,char *__filename)

{
  int iVar1;
  ErrnoError *this_00;
  int *piVar2;
  string nstr;
  
  utf8_to_filename(&nstr,&this->m_path);
  iVar1 = ::remove(nstr._M_dataplus._M_p);
  if (-1 < iVar1) {
    iVar1 = std::__cxx11::string::_M_dispose();
    return iVar1;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void Path::remove() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  if (::remove(nstr.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(m_path);
  bool result = false;

  /* On Windows, `_wremove()` doesn’t work on directories. This
   * function uses the apropriate native Win32API function
   * calls accordingly therefore. */
  if (is_directory())
    result = RemoveDirectoryW(utf16.c_str());
  else
    result = DeleteFileW(utf16.c_str());

  if (!result) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

#else
#error Unsupported system.
#endif
}